

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smart_ban.cpp
# Opt level: O0

void __thiscall
libtorrent::anon_unknown_13::smart_ban_plugin::on_read_failed_block
          (smart_ban_plugin *this,piece_block b,address *a,disk_buffer_holder *buffer,int block_size
          ,storage_error *error)

{
  long *plVar1;
  torrent *ptVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  char *p_00;
  reference pptVar8;
  pointer ppVar9;
  undefined8 uVar10;
  iterator iVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  disk_buffer_holder *pdVar14;
  difference_type dVar15;
  endpoint *ep;
  address *addr;
  span<const_char> in;
  span<const_char> in_00;
  span<const_char> in_01;
  endpoint local_4cc;
  address local_4b0;
  string local_490;
  aux *local_470;
  char *local_468;
  string local_460;
  undefined1 local_440 [8];
  peer_info info_1;
  char *client_1;
  pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>
  local_300;
  const_iterator local_2d8;
  undefined1 local_2c9;
  error_code local_2c8;
  endpoint local_2b4;
  string local_298;
  aux *local_278;
  char *local_270;
  string local_268;
  aux *local_248;
  char *local_240;
  string local_238;
  undefined1 local_218 [8];
  peer_info info;
  char *client;
  _Self local_d8;
  iterator i;
  block_entry e;
  torrent_peer *p;
  undefined1 local_a0 [8];
  pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
  range;
  span<const_char> local_50;
  hasher local_40;
  hasher h;
  storage_error *error_local;
  int block_size_local;
  disk_buffer_holder *buffer_local;
  address *a_local;
  smart_ban_plugin *this_local;
  piece_block b_local;
  
  pdVar14 = buffer;
  h.m_context = (EVP_MD_CTX *)error;
  this_local = (smart_ban_plugin *)b;
  bVar5 = storage_error::operator_cast_to_bool(error);
  if (!bVar5) {
    lcrypto::hasher::hasher(&local_40);
    p_00 = disk_buffer_holder::data(buffer);
    span<const_char>::span(&local_50,p_00,(long)block_size);
    lcrypto::hasher::update(&local_40,local_50);
    libtorrent::aux::torrent::find_peers
              ((pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
                *)local_a0,this->m_torrent,a);
    bVar5 = ::std::operator==((_Self *)local_a0,(_Self *)&range.first._M_node);
    if (!bVar5) {
      pptVar8 = ::std::
                _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                ::operator*((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                             *)local_a0);
      i._M_node = (_Base_ptr)*pptVar8;
      e._24_8_ = i._M_node;
      lcrypto::hasher::final((sha1_hash *)&e,&local_40);
      local_d8._M_node =
           (_Base_ptr)
           ::std::
           map<libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry,_std::less<libtorrent::piece_block>,_std::allocator<std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>_>_>
           ::lower_bound(&this->m_block_hashes,(key_type *)&this_local);
      client = (char *)::std::
                       map<libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry,_std::less<libtorrent::piece_block>,_std::allocator<std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>_>_>
                       ::end(&this->m_block_hashes);
      bVar6 = ::std::operator!=(&local_d8,(_Self *)&client);
      dVar15 = CONCAT71((int7)((ulong)pdVar14 >> 8),bVar6);
      bVar5 = false;
      if (bVar6) {
        ppVar9 = ::std::
                 _Rb_tree_iterator<std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>_>
                 ::operator->(&local_d8);
        bVar6 = piece_block::operator==(&ppVar9->first,(piece_block *)&this_local);
        dVar15 = CONCAT71((int7)((ulong)dVar15 >> 8),bVar6);
        bVar5 = false;
        if (bVar6) {
          ppVar9 = ::std::
                   _Rb_tree_iterator<std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>_>
                   ::operator->(&local_d8);
          bVar5 = (ppVar9->second).peer == (torrent_peer *)e._24_8_;
        }
      }
      if (bVar5) {
        if ((*(uint *)(e._24_8_ + 0x1b) >> 0x1b & 1) == 0) {
          ppVar9 = ::std::
                   _Rb_tree_iterator<std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>_>
                   ::operator->(&local_d8);
          bVar5 = digest32<160L>::operator!=(&(ppVar9->second).digest,(digest32<160L> *)&e);
          if (bVar5) {
            uVar7 = (*(this->m_torrent->super_request_callback)._vptr_request_callback[6])();
            if ((uVar7 & 1) != 0) {
              info._296_8_ = (long)"!--" + 2;
              v1_2::peer_info::peer_info((peer_info *)local_218);
              if (*(long *)(e._24_8_ + 8) != 0) {
                (**(code **)(**(long **)(e._24_8_ + 8) + 0x80))(*(long **)(e._24_8_ + 8),local_218);
                info._296_8_ = ::std::__cxx11::string::c_str();
              }
              ptVar2 = this->m_torrent;
              uVar7 = libtorrent::aux::strong_typedef::operator_cast_to_int
                                ((strong_typedef *)&this_local);
              uVar4 = info._296_8_;
              uVar3 = (ulong)this_local >> 0x20;
              ppVar9 = ::std::
                       _Rb_tree_iterator<std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>_>
                       ::operator->(&local_d8);
              span<char_const>::span<libtorrent::digest32<160l>,char,void>
                        ((span<char_const> *)&local_248,&(ppVar9->second).digest);
              in.m_len = dVar15;
              in.m_ptr = local_240;
              libtorrent::aux::to_hex_abi_cxx11_(&local_238,local_248,in);
              uVar12 = ::std::__cxx11::string::c_str();
              span<char_const>::span<libtorrent::digest32<160l>,char,void>
                        ((span<char_const> *)&local_278,(digest32<160L> *)&e);
              in_00.m_len = dVar15;
              in_00.m_ptr = local_270;
              libtorrent::aux::to_hex_abi_cxx11_(&local_268,local_278,in_00);
              uVar13 = ::std::__cxx11::string::c_str();
              libtorrent::aux::torrent_peer::ip(&local_2b4,(torrent_peer *)e._24_8_);
              libtorrent::aux::print_endpoint_abi_cxx11_(&local_298,(aux *)&local_2b4,ep);
              uVar10 = ::std::__cxx11::string::c_str();
              (*(ptVar2->super_request_callback)._vptr_request_callback[7])
                        (ptVar2,
                         "BANNING PEER [ p: %d | b: %d | c: %s | hash1: %s | hash2: %s | ip: %s ]",
                         (ulong)uVar7,uVar3,uVar4,uVar12,uVar13,uVar10);
              ::std::__cxx11::string::~string((string *)&local_298);
              ::std::__cxx11::string::~string((string *)&local_268);
              ::std::__cxx11::string::~string((string *)&local_238);
              v1_2::peer_info::~peer_info((peer_info *)local_218);
            }
            libtorrent::aux::torrent::ban_peer(this->m_torrent,(torrent_peer *)e._24_8_);
            if (*(long *)(e._24_8_ + 8) != 0) {
              plVar1 = *(long **)(e._24_8_ + 8);
              boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                        (&local_2c8,peer_banned,(type *)0x0);
              local_2c9 = 0;
              (**(code **)(*plVar1 + 0x20))(plVar1,&local_2c8,1,0);
            }
          }
        }
      }
      else {
        ::std::
        _Rb_tree_const_iterator<std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>_>
        ::_Rb_tree_const_iterator(&local_2d8,&local_d8);
        ::std::
        pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>
        ::pair<libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry_&,_true>
                  (&local_300,(piece_block *)&this_local,(block_entry *)&i);
        iVar11 = ::std::
                 map<libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry,_std::less<libtorrent::piece_block>,_std::allocator<std::pair<const_libtorrent::piece_block,_libtorrent::(anonymous_namespace)::smart_ban_plugin::block_entry>_>_>
                 ::insert(&this->m_block_hashes,local_2d8,&local_300);
        uVar7 = (*(this->m_torrent->super_request_callback)._vptr_request_callback[6])();
        if ((uVar7 & 1) != 0) {
          info_1._296_8_ = (long)"!--" + 2;
          v1_2::peer_info::peer_info((peer_info *)local_440);
          if (*(long *)(e._24_8_ + 8) != 0) {
            (**(code **)(**(long **)(e._24_8_ + 8) + 0x80))(*(long **)(e._24_8_ + 8),local_440);
            info_1._296_8_ = ::std::__cxx11::string::c_str();
          }
          ptVar2 = this->m_torrent;
          uVar7 = libtorrent::aux::strong_typedef::operator_cast_to_int
                            ((strong_typedef *)&this_local);
          uVar4 = info_1._296_8_;
          uVar3 = (ulong)this_local >> 0x20;
          span<char_const>::span<libtorrent::digest32<160l>,char,void>
                    ((span<char_const> *)&local_470,(digest32<160L> *)&e);
          in_01.m_len = (difference_type)iVar11._M_node;
          in_01.m_ptr = local_468;
          libtorrent::aux::to_hex_abi_cxx11_(&local_460,local_470,in_01);
          uVar12 = ::std::__cxx11::string::c_str();
          libtorrent::aux::torrent_peer::ip(&local_4cc,(torrent_peer *)e._24_8_);
          boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address(&local_4b0,&local_4cc);
          libtorrent::aux::print_address_abi_cxx11_(&local_490,(aux *)&local_4b0,addr);
          uVar13 = ::std::__cxx11::string::c_str();
          (*(ptVar2->super_request_callback)._vptr_request_callback[7])
                    (ptVar2,"STORE BLOCK CRC [ p: %d | b: %d | c: %s | digest: %s | ip: %s ]",
                     (ulong)uVar7,uVar3,uVar4,uVar12,uVar13);
          ::std::__cxx11::string::~string((string *)&local_490);
          ::std::__cxx11::string::~string((string *)&local_460);
          v1_2::peer_info::~peer_info((peer_info *)local_440);
        }
      }
    }
    lcrypto::hasher::~hasher(&local_40);
  }
  return;
}

Assistant:

void on_read_failed_block(piece_block const b, address const a
			, disk_buffer_holder buffer, int const block_size
			, storage_error const& error)
		{
			TORRENT_ASSERT(m_torrent.session().is_single_thread());

			// ignore read errors
			if (error) return;

			hasher h;
			h.update({buffer.data(), block_size});

			auto const range = m_torrent.find_peers(a);

			// there is no peer with this address anymore
			if (range.first == range.second) return;

			aux::torrent_peer* p = (*range.first);
			block_entry e = {p, h.final()};

			auto i = m_block_hashes.lower_bound(b);

			if (i != m_block_hashes.end() && i->first == b && i->second.peer == p)
			{
				// this peer has sent us this block before
				// if the peer is already banned, it doesn't matter if it sent
				// good or bad data. Nothings going to change it
				if (!p->banned && i->second.digest != e.digest)
				{
					// this time the digest of the block is different
					// from the first time it sent it
					// at least one of them must be bad
#ifndef TORRENT_DISABLE_LOGGING
					if (m_torrent.should_log())
					{
						char const* client = "-";
						peer_info info;
						if (p->connection)
						{
							p->connection->get_peer_info(info);
							client = info.client.c_str();
						}
						m_torrent.debug_log("BANNING PEER [ p: %d | b: %d | c: %s"
							" | hash1: %s | hash2: %s | ip: %s ]"
							, static_cast<int>(b.piece_index), b.block_index, client
							, aux::to_hex(i->second.digest).c_str()
							, aux::to_hex(e.digest).c_str()
							, aux::print_endpoint(p->ip()).c_str());
					}
#endif
					m_torrent.ban_peer(p);
					if (p->connection) p->connection->disconnect(
						errors::peer_banned, operation_t::bittorrent);
				}
				// we already have this exact entry in the map
				// we don't have to insert it
				return;
			}

			m_block_hashes.insert(i, std::pair<const piece_block, block_entry>(b, e));

#ifndef TORRENT_DISABLE_LOGGING
			if (m_torrent.should_log())
			{
				char const* client = "-";
				peer_info info;
				if (p->connection)
				{
					p->connection->get_peer_info(info);
					client = info.client.c_str();
				}
				m_torrent.debug_log("STORE BLOCK CRC [ p: %d | b: %d | c: %s"
					" | digest: %s | ip: %s ]"
					, static_cast<int>(b.piece_index), b.block_index, client
					, aux::to_hex(e.digest).c_str()
					, aux::print_address(p->ip().address()).c_str());
			}
#endif
		}